

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvector-generator.cpp
# Opt level: O0

void export_gguf(vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *v_ctrl,string *fname,
                string *model_hint)

{
  undefined8 uVar1;
  char *__rhs;
  ggml_tensor *t;
  size_type sVar2;
  const_reference ppgVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  char *in_RSI;
  vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *in_RDI;
  size_t i;
  string arch;
  gguf_context *ctx;
  char *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  allocator<char> *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  ulong local_a0;
  string local_98 [32];
  string local_78 [55];
  allocator<char> local_41;
  string local_40 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *local_8;
  
  local_8 = in_RDI;
  local_20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gguf_init_empty();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_RDX,in_RSI,in_stack_ffffffffffffff40);
  std::allocator<char>::~allocator(&local_41);
  pbVar4 = local_20;
  uVar1 = std::__cxx11::string::c_str();
  gguf_set_val_str(pbVar4,"general.architecture",uVar1);
  __lhs = local_20;
  std::operator+(local_20,in_stack_ffffffffffffff30);
  __rhs = (char *)std::__cxx11::string::c_str();
  uVar1 = std::__cxx11::string::c_str();
  gguf_set_val_str(__lhs,__rhs,uVar1);
  std::__cxx11::string::~string(local_78);
  pbVar4 = local_20;
  std::operator+(__lhs,__rhs);
  t = (ggml_tensor *)std::__cxx11::string::c_str();
  sVar2 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::size(local_8);
  gguf_set_val_i32(pbVar4,t,sVar2 & 0xffffffff);
  std::__cxx11::string::~string(local_98);
  local_a0 = 0;
  while( true ) {
    sVar2 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::size(local_8);
    pbVar4 = local_20;
    if (sVar2 <= local_a0) break;
    ppgVar3 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                        (local_8,local_a0);
    gguf_add_tensor(pbVar4,*ppgVar3);
    std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[](local_8,local_a0);
    print_debug_tensor(t,SUB81(local_a0 >> 0x38,0));
    ppgVar3 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                        (local_8,local_a0);
    printf("Added tensor: %s\n",(*ppgVar3)->name);
    local_a0 = local_a0 + 1;
  }
  printf("%s: writing file...\n","export_gguf");
  pbVar4 = local_20;
  uVar1 = std::__cxx11::string::c_str();
  gguf_write_to_file(pbVar4,uVar1,0);
  uVar1 = std::__cxx11::string::c_str();
  printf("%s: wrote file \'%s\'\n","export_gguf",uVar1);
  gguf_free(local_20);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

static void export_gguf(const std::vector<struct ggml_tensor *> & v_ctrl, const std::string fname, const std::string model_hint) {
    struct gguf_context * ctx = gguf_init_empty();

    const std::string arch = "controlvector";
    gguf_set_val_str(ctx, "general.architecture", arch.c_str());
    gguf_set_val_str(ctx, (arch + ".model_hint").c_str(), model_hint.c_str());
    gguf_set_val_i32(ctx, (arch + ".layer_count").c_str(), v_ctrl.size());

    for (size_t i = 0; i < v_ctrl.size(); ++i) {
        gguf_add_tensor(ctx, v_ctrl[i]);
        print_debug_tensor(v_ctrl[i]);
        printf("Added tensor: %s\n", v_ctrl[i]->name);
    }

    printf("%s: writing file...\n", __func__);
    gguf_write_to_file(ctx, fname.c_str(), false);
    printf("%s: wrote file '%s'\n", __func__, fname.c_str());
    gguf_free(ctx);
}